

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O1

void m256v_mult_row(m256v *M,int r,uint8_t alpha)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  undefined7 in_register_00000011;
  long lVar4;
  
  if ((int)CONCAT71(in_register_00000011,alpha) == 0) {
    if (0 < M->n_col) {
      lVar4 = 0;
      do {
        M->e[lVar4 + M->rstride * (long)r] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 < M->n_col);
    }
  }
  else {
    uVar2 = gf256_log(alpha);
    if (0 < M->n_col) {
      lVar4 = 0;
      do {
        if (M->e[lVar4 + M->rstride * (long)r] != '\0') {
          iVar3 = gf256_log(M->e[lVar4 + M->rstride * (long)r]);
          uVar1 = gf256_exp(iVar3 + (uVar2 & 0xff));
          M->e[lVar4 + M->rstride * (long)r] = uVar1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < M->n_col);
    }
  }
  return;
}

Assistant:

void m256v_mult_row(m256v* M, int r, uint8_t alpha)
{
	/* Special case:  Zero multiplier */
	if (alpha == 0) {
		m256v_clear_row(M, r);
		return;
	}

	/* General case:  Nonzero alpha */
	const uint8_t log_alpha = flog(alpha);
	for (int j = 0; j < M->n_col; ++j) {
		uint8_t v = get_el(M, r, j);
		if (v != 0) {
			set_el(M, r, j, fexp(flog(v) + log_alpha));
		}
	}
}